

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

void bov_window_screenshot(bov_window_t *window,char *filename)

{
  uint uVar1;
  ulong uVar2;
  uchar *puVar3;
  FILE *__stream;
  uchar *row;
  int i;
  FILE *pFile;
  void *newData;
  size_t rowsize;
  int height;
  int width;
  char *filename_local;
  bov_window_t *window_local;
  
  if ((window == (bov_window_t *)0x0) || (filename == (char *)0x0)) {
    free(bov_window_screenshot::data);
  }
  else {
    uVar1 = (uint)(window->param).res[0];
    row._4_4_ = (uint)(window->param).res[1];
    uVar2 = (long)(int)uVar1 * 3 + 3U & 0xfffffffffffffffc;
    puVar3 = (uchar *)realloc(bov_window_screenshot::data,uVar2 * (long)(int)row._4_4_);
    if (puVar3 == (uchar *)0x0) {
      bov_error_log(0x30001,"Memory allocation failed");
      fprintf(_stderr,"\t(in function %s, line %d)\n","bov_window_screenshot",0x62d);
      exit(1);
    }
    bov_window_screenshot::data = puVar3;
    __stream = fopen(filename,"wb");
    if (__stream == (FILE *)0x0) {
      exit(1);
    }
    (*glad_glReadBuffer)(0x404);
    (*glad_glReadPixels)(0,0,uVar1,row._4_4_,0x1907,0x1401,bov_window_screenshot::data);
    fprintf(__stream,"P6\n%d %d\n255\n",(ulong)uVar1,(ulong)row._4_4_);
    while (row._4_4_ = row._4_4_ - 1, -1 < (int)row._4_4_) {
      fwrite(bov_window_screenshot::data + uVar2 * (long)(int)row._4_4_,1,(long)(int)uVar1 * 3,
             __stream);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void bov_window_screenshot(const bov_window_t* window,
                           const char* filename)
{
	static unsigned char* data = NULL;

	if(window==NULL || filename==NULL) {
		free(data);
		return;
	}

	int width = (int) window->param.res[0];
	int height = (int) window->param.res[1];

	size_t rowsize = ((size_t) width * 3 + 3) / 4 * 4; // width of a row in byte
	void* newData = realloc(data, rowsize*height); // width is rounded to multiple of four
	CHECK_MALLOC(newData);
	data = newData; // just for MSVC to be happy

	FILE* pFile;

	pFile=fopen(filename, "wb");
	if(pFile==NULL)
		exit(1);

	glReadBuffer( GL_FRONT );
	glReadPixels( 0, 0, width, height, GL_RGB, GL_UNSIGNED_BYTE, data );

	// Write header
	fprintf(pFile, "P6\n%d %d\n255\n", width, height);

	// Write pixel data
	for(int i=height-1; i>=0; i--) {
		unsigned char *row = data + rowsize*i;
		fwrite(row, 1, (size_t) width*3, pFile);
	}

	// Close file
	fclose(pFile);
}